

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall
Minisat::Solver::binDRUP<Minisat::vec<Minisat::Lit>>
          (Solver *this,uchar op,vec<Minisat::Lit> *c,FILE *drup_file)

{
  int iVar1;
  uchar *puVar2;
  OnlineProofChecker *this_00;
  bool bVar3;
  int i;
  long lVar4;
  
  puVar2 = this->buf_ptr;
  this->buf_ptr = puVar2 + 1;
  *puVar2 = op;
  this->buf_len = this->buf_len + 1;
  this_00 = this->onlineDratChecker;
  if (this_00 != (OnlineProofChecker *)0x0) {
    if (op == 'a') {
      bVar3 = OnlineProofChecker::addClause<Minisat::vec<Minisat::Lit>>
                        (this_00,c,(Lit *)&lit_Undef,false);
    }
    else {
      bVar3 = OnlineProofChecker::removeClause<Minisat::vec<Minisat::Lit>>(this_00,c);
    }
    if (bVar3 == false) {
      exit(0x86);
    }
  }
  for (lVar4 = 0; lVar4 < c->sz; lVar4 = lVar4 + 1) {
    byteDRUP(this,(Lit)c->data[lVar4].x);
  }
  puVar2 = this->buf_ptr;
  this->buf_ptr = puVar2 + 1;
  *puVar2 = '\0';
  iVar1 = this->buf_len;
  this->buf_len = iVar1 + 1;
  if (0xfffff < iVar1) {
    binDRUP_flush(this,drup_file);
    return;
  }
  return;
}

Assistant:

inline void binDRUP(unsigned char op, const V &c, FILE *drup_file)
    {
        assert(op == 'a' || op == 'd');
        *buf_ptr++ = op;
        buf_len++;
        if (onlineDratChecker) {
            if (op == 'a') {
                TRACE(if (!checkOnlineCheckerState(c)) {
                    std::cout << "c failed to validate online checker state" << std::endl;
                });

                if (!onlineDratChecker->addClause(c, lit_Undef)) {
                    exit(134);
                }
            } else {
                if (!onlineDratChecker->removeClause(c)) exit(134);
            }
        }
        for (int i = 0; i < c.size(); i++) byteDRUP(c[i]);
        *buf_ptr++ = 0;
        buf_len++;
        if (buf_len > 1048576) binDRUP_flush(drup_file);
    }